

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O3

void __thiscall
GlobOpt::CaptureArguments
          (GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo,JitArenaAllocator *allocator)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  SymID id;
  Type_conflict pBVar6;
  ulong uVar7;
  ulong uVar8;
  
  pBVar6 = ((this->currentBlock->globOptData).argObjSyms)->head;
  if (pBVar6 != (Type_conflict)0x0) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      uVar7 = (pBVar6->data).word;
      if (uVar7 != 0) {
        TVar1 = pBVar6->startIndex;
        uVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        do {
          id = TVar1 + (BVIndex)uVar8;
          BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar8);
          pSVar5 = SymTable::FindStackSym(this->func->m_symTable,id);
          if (pSVar5 == (StackSym *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar4 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x123,"(stackSym != nullptr)","stackSym != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *puVar4 = 0;
          }
          if ((pSVar5->field_0x19 & 0x20) != 0) {
            this_00 = bailOutInfo->capturedValues->argObjSyms;
            if (this_00 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
              this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                        new<Memory::JitArenaAllocator>(0x20,allocator,0x3eba5c);
              this_00->head = (Type_conflict)0x0;
              this_00->lastFoundIndex = (Type_conflict)0x0;
              this_00->alloc = allocator;
              this_00->lastUsedNodePrevNextField = (Type)this_00;
              bailOutInfo->capturedValues->argObjSyms = this_00;
            }
            BVSparse<Memory::JitArenaAllocator>::Set(this_00,id);
          }
          uVar7 = uVar7 & ~(1L << (uVar8 & 0x3f));
          uVar8 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
            }
          }
        } while (uVar7 != 0);
      }
      pBVar6 = pBVar6->next;
    } while (pBVar6 != (Type)0x0);
  }
  return;
}

Assistant:

void
GlobOpt::CaptureArguments(BasicBlock *block, BailOutInfo * bailOutInfo, JitArenaAllocator *allocator)
{
    FOREACH_BITSET_IN_SPARSEBV(id, this->currentBlock->globOptData.argObjSyms)
    {
        StackSym * stackSym = this->func->m_symTable->FindStackSym(id);
        Assert(stackSym != nullptr);
        if (!stackSym->HasByteCodeRegSlot())
        {
            continue;
        }

        if (!bailOutInfo->capturedValues->argObjSyms)
        {
            bailOutInfo->capturedValues->argObjSyms = JitAnew(allocator, BVSparse<JitArenaAllocator>, allocator);
        }

        bailOutInfo->capturedValues->argObjSyms->Set(id);
        // Add to BailOutInfo
    }
    NEXT_BITSET_IN_SPARSEBV
}